

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  int fds_stdout [2];
  int fds_stdin [2];
  uv_buf_t local_9c8;
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uv_process_t child_req;
  uv_write_t write_req;
  uchar ubuf [1023];
  
  init_process_options("spawn_helper9",exit_cb);
  puVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar3,&pipe_stdin_child,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_init(puVar3,&pipe_stdout_child,0);
    if (iVar1 == 0) {
      iVar1 = uv_pipe_init(puVar3,&pipe_stdin_parent,0);
      if (iVar1 == 0) {
        iVar1 = uv_pipe_init(puVar3,&pipe_stdout_parent,0);
        if (iVar1 == 0) {
          iVar1 = mpipe(fds_stdin);
          if (iVar1 == -1) {
            pcVar5 = "mpipe(fds_stdin) != -1";
            uVar4 = 0x6fd;
          }
          else {
            iVar1 = mpipe(fds_stdout);
            if (iVar1 == -1) {
              pcVar5 = "mpipe(fds_stdout) != -1";
              uVar4 = 0x6fe;
            }
            else {
              iVar1 = uv_pipe_open(&pipe_stdin_child,fds_stdin[0]);
              if (iVar1 == 0) {
                iVar1 = uv_pipe_open(&pipe_stdout_child,fds_stdout[1]);
                if (iVar1 == 0) {
                  iVar1 = uv_pipe_open(&pipe_stdin_parent,fds_stdin[1]);
                  if (iVar1 == 0) {
                    iVar1 = uv_pipe_open(&pipe_stdout_parent,fds_stdout[0]);
                    if (iVar1 == 0) {
                      iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdin_child);
                      if (iVar1 == 0) {
                        pcVar5 = "uv_is_readable((uv_stream_t*) &pipe_stdin_child)";
                        uVar4 = 0x704;
                      }
                      else {
                        iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdout_child);
                        if (iVar1 == 0) {
                          pcVar5 = "uv_is_writable((uv_stream_t*) &pipe_stdout_child)";
                          uVar4 = 0x705;
                        }
                        else {
                          iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdin_parent);
                          if (iVar1 == 0) {
                            pcVar5 = "uv_is_writable((uv_stream_t*) &pipe_stdin_parent)";
                            uVar4 = 0x706;
                          }
                          else {
                            iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdout_parent);
                            if (iVar1 == 0) {
                              pcVar5 = "uv_is_readable((uv_stream_t*) &pipe_stdout_parent)";
                              uVar4 = 0x707;
                            }
                            else {
                              iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdin_child);
                              iVar2 = uv_is_readable((uv_stream_t *)&pipe_stdout_child);
                              if (iVar2 == iVar1) {
                                iVar2 = uv_is_readable((uv_stream_t *)&pipe_stdin_parent);
                                if (iVar2 == iVar1) {
                                  iVar2 = uv_is_writable((uv_stream_t *)&pipe_stdout_parent);
                                  if (iVar2 == iVar1) {
                                    options.stdio = child_stdio;
                                    child_stdio[0].flags = UV_INHERIT_STREAM;
                                    options.stdio_count = 2;
                                    child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;
                                    child_stdio[1].flags = child_stdio[0].flags;
                                    child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;
                                    iVar1 = uv_spawn(puVar3,&child_req,&options);
                                    if (iVar1 == 0) {
                                      uv_close((uv_handle_t *)&pipe_stdin_child,(uv_close_cb)0x0);
                                      uv_close((uv_handle_t *)&pipe_stdout_child,(uv_close_cb)0x0);
                                      local_9c8 = uv_buf_init((char *)ubuf,0x3ff);
                                      for (lVar6 = 0; lVar6 != 0x3ff; lVar6 = lVar6 + 1) {
                                        ubuf[lVar6] = (uchar)lVar6;
                                      }
                                      memset(output,0,0x3ff);
                                      iVar1 = uv_write(&write_req,(uv_stream_t *)&pipe_stdin_parent,
                                                       &local_9c8,1,write_cb);
                                      if (iVar1 == 0) {
                                        iVar1 = uv_read_start((uv_stream_t *)&pipe_stdout_parent,
                                                              on_alloc,on_read);
                                        if (iVar1 == 0) {
                                          iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
                                          if (iVar1 == 0) {
                                            if (exit_cb_called == 1) {
                                              if (close_cb_called == 3) {
                                                iVar1 = bcmp(ubuf,output,0x3ff);
                                                if (iVar1 == 0) {
                                                  puVar3 = uv_default_loop();
                                                  close_loop(puVar3);
                                                  puVar3 = uv_default_loop();
                                                  iVar1 = uv_loop_close(puVar3);
                                                  if (iVar1 == 0) {
                                                    return 0;
                                                  }
                                                  pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                                                  uVar4 = 0x734;
                                                }
                                                else {
                                                  pcVar5 = "r == 0";
                                                  uVar4 = 0x732;
                                                }
                                              }
                                              else {
                                                pcVar5 = "close_cb_called == 3";
                                                uVar4 = 0x72f;
                                              }
                                            }
                                            else {
                                              pcVar5 = "exit_cb_called == 1";
                                              uVar4 = 0x72e;
                                            }
                                          }
                                          else {
                                            pcVar5 = "r == 0";
                                            uVar4 = 0x72c;
                                          }
                                        }
                                        else {
                                          pcVar5 = "r == 0";
                                          uVar4 = 0x729;
                                        }
                                      }
                                      else {
                                        pcVar5 = "r == 0";
                                        uVar4 = 0x726;
                                      }
                                    }
                                    else {
                                      pcVar5 = "uv_spawn(loop, &child_req, &options) == 0";
                                      uVar4 = 0x717;
                                    }
                                  }
                                  else {
                                    pcVar5 = 
                                    "uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir";
                                    uVar4 = 0x70c;
                                  }
                                }
                                else {
                                  pcVar5 = 
                                  "uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir";
                                  uVar4 = 0x70b;
                                }
                              }
                              else {
                                pcVar5 = 
                                "uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir";
                                uVar4 = 0x70a;
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      pcVar5 = "uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0";
                      uVar4 = 0x703;
                    }
                  }
                  else {
                    pcVar5 = "uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0";
                    uVar4 = 0x702;
                  }
                }
                else {
                  pcVar5 = "uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0";
                  uVar4 = 0x701;
                }
              }
              else {
                pcVar5 = "uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0";
                uVar4 = 0x700;
              }
            }
          }
        }
        else {
          pcVar5 = "uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0";
          uVar4 = 0x6fb;
        }
      }
      else {
        pcVar5 = "uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0";
        uVar4 = 0x6fa;
      }
    }
    else {
      pcVar5 = "uv_pipe_init(loop, &pipe_stdout_child, 0) == 0";
      uVar4 = 0x6f9;
    }
  }
  else {
    pcVar5 = "uv_pipe_init(loop, &pipe_stdin_child, 0) == 0";
    uVar4 = 0x6f8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(mpipe(fds_stdin) != -1);
  ASSERT(mpipe(fds_stdout) != -1);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*)&pipe_stdin_child, NULL);
  uv_close((uv_handle_t*)&pipe_stdout_child, NULL);

  buf = uv_buf_init((char*)ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*)&pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}